

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O1

bool __thiscall wavingz::demod::state_machine::sample_sm_t::idle(sample_sm_t *this)

{
  state_base_t *psVar1;
  char *pcVar2;
  symbol_sm_t *psVar3;
  int iVar4;
  symbol_sm_t *psVar5;
  undefined8 *in_RSI;
  bool bVar6;
  
  psVar1 = (this->current_state_m)._M_t.
           super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
           .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
           _M_head_impl;
  if (psVar1 != (state_base_t *)0x0) {
    pcVar2 = *(char **)(psVar1->_vptr_state_base_t[-1] + 8);
    if (pcVar2 == "N7wavingz5demod13state_machine9sample_sm6idle_tE") {
      bVar6 = true;
    }
    else if (*pcVar2 == '*') {
      bVar6 = false;
    }
    else {
      iVar4 = strcmp(pcVar2,"N7wavingz5demod13state_machine9sample_sm6idle_tE");
      bVar6 = iVar4 == 0;
    }
    return bVar6;
  }
  __cxa_bad_typeid();
  psVar1 = (this->current_state_m)._M_t.
           super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
           .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
           _M_head_impl;
  if (psVar1 != (state_base_t *)0x0) {
    pcVar2 = *(char **)(psVar1->_vptr_state_base_t[-1] + 8);
    bVar6 = true;
    if (pcVar2 != "N7wavingz5demod13state_machine9sample_sm10preamble_tE") {
      if ((*pcVar2 != '*') &&
         (iVar4 = strcmp(pcVar2,"N7wavingz5demod13state_machine9sample_sm10preamble_tE"), iVar4 == 0
         )) {
        return true;
      }
      if (pcVar2 != "N7wavingz5demod13state_machine9sample_sm9lead_in_tE") {
        if (*pcVar2 == '*') {
          bVar6 = false;
        }
        else {
          iVar4 = strcmp(pcVar2,"N7wavingz5demod13state_machine9sample_sm9lead_in_tE");
          bVar6 = iVar4 == 0;
        }
      }
    }
    return bVar6;
  }
  __cxa_bad_typeid();
  psVar1 = (state_base_t *)this->sample_rate;
  psVar5 = (this->sym_sm)._M_data;
  psVar3 = this[1].sym_sm._M_data;
  if ((symbol_sm_t *)((long)psVar5 - (long)psVar1 >> 3) == psVar3) {
    if (psVar3 != (symbol_sm_t *)0x0) {
      if ((this->current_state_m)._M_t.
          super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
          ._M_t.
          super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
          .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
          _M_head_impl == psVar1) {
        (this->current_state_m)._M_t.
        super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
        ._M_t.
        super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
        .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
        _M_head_impl = (state_base_t *)psVar5;
      }
      psVar1 = (this->current_state_m)._M_t.
               super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
               .
               super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>
               ._M_head_impl;
      (this->current_state_m)._M_t.
      super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
      _M_head_impl = psVar1 + -1;
      psVar1[-1]._vptr_state_base_t = (_func_int **)*in_RSI;
      this[1].sample_rate = (size_t)(psVar1 + -1);
      return SUB81(psVar1,0);
    }
  }
  else {
    if ((this->current_state_m)._M_t.
        super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
        ._M_t.
        super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
        .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
        _M_head_impl == psVar1) {
      (this->current_state_m)._M_t.
      super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
      _M_head_impl = (state_base_t *)psVar5;
    }
    psVar5 = (symbol_sm_t *)
             (this->current_state_m)._M_t.
             super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
             .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>
             ._M_head_impl;
    (this->current_state_m)._M_t.
    super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
    _M_head_impl = (state_base_t *)((long)(psVar5 + 0xffffffffffffffff) + 0x20);
    ((unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
      *)((long)(psVar5 + 0xffffffffffffffff) + 0x20))->_M_t =
         (__uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
          )*in_RSI;
    this[1].sym_sm._M_data =
         (symbol_sm_t *)((long)&(psVar3->callback).super__Function_base._M_functor + 1);
  }
  return SUB81(psVar5,0);
}

Assistant:

bool idle() { return typeid(*current_state_m.get()) == typeid(sample_sm::idle_t); }